

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test1DLinearResourceArrays_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceArrays_Test *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  int iVar3;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar4;
  uint32_t i;
  TEST_BPP Bpp;
  undefined8 uStack_b8;
  GMM_RESCREATE_PARAMS gmmParams;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_b8 = 1;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x80000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 4;
  for (Bpp = TEST_BPP_8; Bpp != TEST_BPP_MAX; Bpp = Bpp + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,Bpp);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    gmmParams.CpTag = 0x1001;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&uStack_b8);
    uVar4 = gmmParams.CpTag + 0x3f & 0xffffffc0;
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,Bpp);
    iVar3 = uVar2 * gmmParams.Depth;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo,(ulong)(iVar3 * uVar4 + 0xfff & 0xfffff000));
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo,(ulong)uVar4);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceArrays)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1001;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes * gmmParams.ArraySize, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<true>(ResourceInfo, AlignedWidth);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}